

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *outputName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *condition,bool inputIsContent)

{
  PolicyStatus policyStatusCMP0070;
  cmGeneratorExpressionEvaluationFile *this_00;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_68;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_60;
  string local_58;
  cmGeneratorExpressionEvaluationFile *local_38;
  
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_58,(string *)inputFile);
  local_60._M_head_impl =
       (outputName->_M_t).
       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
       .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  (outputName->_M_t).
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (cmCompiledGeneratorExpression *)0x0;
  local_68._M_head_impl =
       (condition->_M_t).
       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
       .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  (condition->_M_t).
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (cmCompiledGeneratorExpression *)0x0;
  policyStatusCMP0070 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0070,false);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,&local_58,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&local_60,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&local_68,inputIsContent,policyStatusCMP0070);
  local_38 = this_00;
  std::
  vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
  ::emplace_back<cmGeneratorExpressionEvaluationFile*>
            ((vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
              *)&this->EvaluationFiles,&local_38);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_68);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_60);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile,
  std::unique_ptr<cmCompiledGeneratorExpression> outputName,
  std::unique_ptr<cmCompiledGeneratorExpression> condition,
  bool inputIsContent)
{
  this->EvaluationFiles.push_back(new cmGeneratorExpressionEvaluationFile(
    inputFile, std::move(outputName), std::move(condition), inputIsContent,
    this->GetPolicyStatus(cmPolicies::CMP0070)));
}